

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Tags::Tag::Parse(Tag *this,IMkvReader *pReader,longlong pos,longlong size)

{
  long stop;
  bool bVar1;
  long lVar2;
  long lVar3;
  long unaff_RBP;
  longlong size_1;
  longlong id;
  longlong local_50;
  Tag *local_48;
  long local_40;
  long local_38;
  
  stop = size + pos;
  if (0 < size) {
    local_50 = pos;
    local_48 = this;
    do {
      lVar3 = ParseElementHeader(pReader,&local_50,stop,&local_38,&local_40);
      lVar2 = local_40;
      bVar1 = true;
      if (-1 < lVar3) {
        if (local_40 == 0) {
          bVar1 = false;
          lVar3 = unaff_RBP;
        }
        else if ((local_38 != 0x67c8) ||
                (lVar3 = ParseSimpleTag(local_48,pReader,local_50,local_40), -1 < lVar3)) {
          local_50 = lVar2 + local_50;
          bVar1 = stop < local_50;
          lVar3 = unaff_RBP;
          if (stop < local_50) {
            lVar3 = -2;
          }
        }
      }
      if (bVar1) {
        return lVar3;
      }
      pos = local_50;
      unaff_RBP = lVar3;
    } while (local_50 < stop);
  }
  return (ulong)(pos == stop) * 2 + -2;
}

Assistant:

long Tags::Tag::Parse(IMkvReader* pReader, long long pos, long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)
      return status;

    if (size == 0)  // 0 length tag, read another
      continue;

    if (id == libwebm::kMkvSimpleTag) {
      status = ParseSimpleTag(pReader, pos, size);

      if (status < 0)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}